

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TrackedSection * __thiscall
Catch::SectionTracking::TrackedSection::acquireChild(TrackedSection *this,string *childName)

{
  TrackedSection *this_00;
  undefined1 uVar1;
  string *in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TrackedSection>_>::value,_pair<iterator,_bool>_>
  _Var2;
  TrackedSection *child;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
  *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec8;
  TrackedSection *in_stack_fffffffffffffed0;
  TrackedSection *this_01;
  TrackedSection local_100 [2];
  TrackedSection *local_20;
  string *local_18;
  TrackedSection *local_8;
  
  local_18 = in_RSI;
  local_20 = findChild(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_8 = local_20;
  if (local_20 == (TrackedSection *)0x0) {
    this_00 = (TrackedSection *)(in_RDI + 0x28);
    this_01 = local_100;
    TrackedSection(this_00,&in_stack_fffffffffffffeb8->first,
                   (TrackedSection *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    std::make_pair<std::__cxx11::string_const&,Catch::SectionTracking::TrackedSection>
              (&in_stack_fffffffffffffeb8->first,
               (TrackedSection *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    _Var2 = std::
            map<std::__cxx11::string,Catch::SectionTracking::TrackedSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
            ::insert<std::pair<std::__cxx11::string,Catch::SectionTracking::TrackedSection>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
                        *)this_00,in_stack_fffffffffffffeb8);
    uVar1 = _Var2.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
             *)CONCAT17(uVar1,in_stack_fffffffffffffeb0));
    ~TrackedSection((TrackedSection *)CONCAT17(uVar1,in_stack_fffffffffffffeb0));
    local_8 = findChild(this_01,local_18);
  }
  return local_8;
}

Assistant:

TrackedSection* acquireChild( std::string const& childName ) {
            if( TrackedSection* child = findChild( childName ) )
                return child;
            m_children.insert( std::make_pair( childName, TrackedSection( childName, this ) ) );
            return findChild( childName );
        }